

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::releaseExclusivePublication(ClientConductor *this,int64_t registrationId)

{
  bool bVar1;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  __position;
  long in_RDI;
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  *this_00;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  __normal_iterator<const_aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  *in_stack_ffffffffffffff80;
  anon_class_8_1_0d1909f2_for__M_pred in_stack_ffffffffffffff98;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  in_stack_ffffffffffffffa8;
  
  verifyDriverIsActiveViaErrorHandler((ClientConductor *)lock._M_device);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
            );
  this_00 = (vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
             *)(in_RDI + 0x48);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::begin((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           *)in_stack_ffffffffffffff78);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::end((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
         *)in_stack_ffffffffffffff78);
  __position = std::
               find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn*,std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>>>,aeron::ClientConductor::releaseExclusivePublication(long)::__0>
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::end((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
         *)in_stack_ffffffffffffff78);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                      *)in_stack_ffffffffffffff80,
                     (__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                      *)in_stack_ffffffffffffff78);
  if (bVar1) {
    DriverProxy::removePublication
              ((DriverProxy *)in_stack_ffffffffffffffa0._M_current,(int64_t)__position._M_current);
    __gnu_cxx::
    __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_const*,std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>>>
    ::__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                *)(in_RDI + 0x48));
    std::
    vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
    ::erase(this_00,(const_iterator)__position._M_current);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c4b80);
  return;
}

Assistant:

void ClientConductor::releaseExclusivePublication(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [registrationId](const ExclusivePublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it != m_exclusivePublications.end())
    {
        m_driverProxy.removePublication(registrationId);
        m_exclusivePublications.erase(it);
    }
}